

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O1

ion_err_t ion_open_dictionary(ion_dictionary_handler_t *handler,ion_dictionary_t *dictionary,
                             ion_dictionary_id_t id)

{
  ion_err_t iVar1;
  ion_err_t iVar2;
  ion_dictionary_config_info_t config;
  ion_dictionary_config_info_t local_38;
  
  local_38.id = id;
  iVar1 = ion_master_table_read(&local_38,-1);
  iVar2 = '\x12';
  if (iVar1 == '\0') {
    ion_switch_handler(local_38.dictionary_type,handler);
    iVar2 = dictionary_open(handler,dictionary,&local_38);
  }
  return iVar2;
}

Assistant:

ion_err_t
ion_open_dictionary(
	ion_dictionary_handler_t	*handler,		/* Passed in empty, to be set. */
	ion_dictionary_t			*dictionary,	/* Passed in empty, to be set. */
	ion_dictionary_id_t			id
) {
	ion_err_t						err;
	ion_dictionary_config_info_t	config;

	err = ion_lookup_in_master_table(id, &config);

	/* Lookup for id failed. */
	if (err_ok != err) {
		return err_uninitialized;
	}

	ion_switch_handler(config.dictionary_type, handler);

	err = dictionary_open(handler, dictionary, &config);

	return err;
}